

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 float64_rem_riscv32(float64 a,float64 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float64 fVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  
  if ((status->flush_inputs_to_zero != '\0') &&
     ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0)) {
    a = a & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  if ((status->flush_inputs_to_zero != '\0') &&
     ((b & 0xfffffffffffff) != 0 && (b & 0x7ff0000000000000) == 0)) {
    b = b & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  uVar9 = a & 0xfffffffffffff;
  uVar14 = (uint)(a >> 0x34) & 0x7ff;
  uVar18 = b & 0xfffffffffffff;
  uVar8 = (uint)(b >> 0x34) & 0x7ff;
  if (uVar14 == 0x7ff) {
    if ((uVar9 != 0) || (uVar18 != 0 && uVar8 == 0x7ff)) {
LAB_00c081f6:
      fVar3 = propagateFloat64NaN(a,b,status);
      return fVar3;
    }
LAB_00c08383:
    status->float_exception_flags = status->float_exception_flags | 1;
    return 0x7ff8000000000000;
  }
  if (uVar8 == 0) {
    if (uVar18 == 0) goto LAB_00c08383;
    lVar11 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    uVar8 = ((uint)lVar11 ^ 0x3f) + 0xf5;
    uVar18 = uVar18 << ((byte)uVar8 & 0x3f);
    uVar8 = 1 - (uVar8 & 0xff);
  }
  else if (uVar8 == 0x7ff) {
    if (uVar18 == 0) {
      return a;
    }
    goto LAB_00c081f6;
  }
  if (uVar14 == 0) {
    if (uVar9 == 0) {
      return a;
    }
    lVar11 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    uVar14 = ((uint)lVar11 ^ 0x3f) + 0xf5;
    uVar9 = uVar9 << ((byte)uVar14 & 0x3f);
    uVar14 = 1 - (uVar14 & 0xff);
  }
  uVar9 = uVar9 << 0xb | 0x8000000000000000;
  iVar15 = uVar14 - uVar8;
  if (iVar15 < 0) {
    if (iVar15 != -1) {
      return a;
    }
    uVar9 = uVar9 >> 1;
  }
  uVar4 = uVar18 << 0xb;
  uVar7 = uVar4 | 0x8000000000000000;
  uVar10 = 0;
  if (uVar7 <= uVar9) {
    uVar10 = uVar7;
  }
  uVar10 = uVar9 - uVar10;
  iVar12 = iVar15 + -0x40;
  if (iVar15 < 0x41) {
    uVar9 = (ulong)(uVar7 <= uVar9);
  }
  else {
    uVar16 = uVar7 >> 0x20;
    uVar17 = uVar4 & 0xffffffff00000000 | 0x8000000000000000;
    iVar15 = iVar12;
    do {
      uVar5 = 0xffffffffffffffff;
      if (uVar10 < uVar7) {
        uVar9 = 0xffffffff00000000;
        if (uVar10 < uVar17) {
          uVar9 = uVar10 / uVar16 << 0x20;
        }
        uVar6 = (uVar9 >> 0x20) * (uVar4 & 0xffffffff);
        uVar13 = uVar9 * uVar7;
        uVar5 = -uVar13;
        for (lVar11 = ((uVar10 - ((uVar6 >> 0x20) + uVar16 * (uVar9 >> 0x20))) -
                      (ulong)(uVar13 != 0)) - (ulong)(uVar13 < uVar6 << 0x20); lVar11 < 0;
            lVar11 = lVar11 + uVar16 + (ulong)bVar19) {
          uVar9 = uVar9 - 0x100000000;
          bVar19 = CARRY8(uVar5,uVar18 << 0x2b);
          uVar5 = uVar5 + (uVar18 << 0x2b);
        }
        uVar10 = uVar5 >> 0x20 | lVar11 << 0x20;
        uVar5 = 0xffffffff;
        if (uVar10 < uVar17) {
          uVar5 = uVar10 / uVar16;
        }
        uVar5 = uVar5 | uVar9;
      }
      uVar9 = 0;
      if (1 < uVar5) {
        uVar9 = uVar5 - 2;
      }
      uVar10 = -((uVar7 >> 2) * uVar9);
      iVar12 = iVar15 + -0x3e;
      bVar19 = 0x3e < iVar15;
      iVar15 = iVar12;
    } while (bVar19);
  }
  if (iVar12 < -0x3f) {
    uVar10 = uVar10 >> 2;
  }
  else {
    uVar16 = 0xffffffffffffffff;
    if (uVar10 < uVar7) {
      uVar17 = uVar7 >> 0x20;
      uVar5 = uVar4 & 0xffffffff00000000 | 0x8000000000000000;
      uVar9 = 0xffffffff00000000;
      if (uVar10 < uVar5) {
        uVar9 = uVar10 / uVar17 << 0x20;
      }
      uVar16 = (uVar4 & 0xffffffff) * (uVar9 >> 0x20);
      uVar6 = uVar9 * uVar7;
      uVar4 = -uVar6;
      lVar11 = ((uVar10 - ((uVar16 >> 0x20) + (uVar9 >> 0x20) * uVar17)) - (ulong)(uVar6 != 0)) -
               (ulong)(uVar6 < uVar16 << 0x20);
      if (lVar11 < 0) {
        do {
          uVar9 = uVar9 - 0x100000000;
          bVar19 = CARRY8(uVar4,uVar18 << 0x2b);
          uVar4 = uVar4 + (uVar18 << 0x2b);
          lVar11 = lVar11 + uVar17 + (ulong)bVar19;
        } while (lVar11 < 0);
      }
      uVar18 = uVar4 >> 0x20 | lVar11 << 0x20;
      uVar16 = 0xffffffff;
      if (uVar18 < uVar5) {
        uVar16 = uVar18 / uVar17;
      }
      uVar16 = uVar16 | uVar9;
    }
    uVar9 = 0;
    if (1 < uVar16) {
      uVar9 = uVar16 - 2;
    }
    uVar9 = uVar9 >> (-(char)iVar12 & 0x3fU);
    uVar10 = ((uVar10 >> 1) << ((char)iVar12 + 0x3fU & 0x3f)) - uVar9 * (uVar7 >> 2);
  }
  uVar7 = uVar7 >> 2;
  uVar18 = 0xffffffffffffffff;
  if ((long)(uVar10 - uVar7) < -1) {
    uVar18 = uVar10 - uVar7;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = ~uVar18 + uVar10;
  uVar18 = SUB168(auVar2 / auVar1,0);
  uVar4 = uVar10 - uVar7 * uVar18;
  uVar10 = ~uVar18 * uVar7 + uVar10;
  lVar11 = uVar10 + uVar4;
  if ((lVar11 < 0) || (lVar11 == 0 && ((int)uVar9 + SUB164(auVar2 / auVar1,0) & 1U) == 0)) {
    uVar10 = uVar4;
  }
  uVar9 = -uVar10;
  if (0 < (long)uVar10) {
    uVar9 = uVar10;
  }
  if (uVar9 == 0) {
    uVar14 = 0x40;
  }
  else {
    lVar11 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    uVar14 = (uint)lVar11 ^ 0x3f;
  }
  fVar3 = roundAndPackFloat64((byte)((byte)(a >> 0x38) ^ (byte)(uVar10 >> 0x38)) >> 7,
                              uVar8 - (uVar14 - 1),uVar9 << ((byte)(uVar14 - 1) & 0x3f),status);
  return fVar3;
}

Assistant:

float64 float64_rem(float64 a, float64 b, float_status *status)
{
    flag aSign, zSign;
    int aExp, bExp, expDiff;
    uint64_t aSig, bSig;
    uint64_t q, alternateASig;
    int64_t sigMean;

    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    bSig = extractFloat64Frac( b );
    bExp = extractFloat64Exp( b );
    if ( aExp == 0x7FF ) {
        if ( aSig || ( ( bExp == 0x7FF ) && bSig ) ) {
            return propagateFloat64NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    if ( bExp == 0x7FF ) {
        if (bSig) {
            return propagateFloat64NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            float_raise(float_flag_invalid, status);
            return float64_default_nan(status);
        }
        normalizeFloat64Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return a;
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    expDiff = aExp - bExp;
    aSig = (aSig | UINT64_C(0x0010000000000000)) << 11;
    bSig = (bSig | UINT64_C(0x0010000000000000)) << 11;
    if ( expDiff < 0 ) {
        if ( expDiff < -1 ) return a;
        aSig >>= 1;
    }
    q = ( bSig <= aSig );
    if ( q ) aSig -= bSig;
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig, 0, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
#ifdef _MSC_VER
        aSig = 0ULL - ( ( bSig>>2 ) * q );
#else
        aSig = - ( ( bSig>>2 ) * q );
#endif
        expDiff -= 62;
    }
    expDiff += 64;
    if ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig, 0, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        q >>= 64 - expDiff;
        bSig >>= 2;
        aSig = ( ( aSig>>1 )<<( expDiff - 1 ) ) - bSig * q;
    }
    else {
        aSig >>= 2;
        bSig >>= 2;
    }
    do {
        alternateASig = aSig;
        ++q;
        aSig -= bSig;
    } while ( 0 <= (int64_t) aSig );
    sigMean = aSig + alternateASig;
    if ( ( sigMean < 0 ) || ( ( sigMean == 0 ) && ( q & 1 ) ) ) {
        aSig = alternateASig;
    }
    zSign = ( (int64_t) aSig < 0 );
#ifdef _MSC_VER
    if ( zSign ) aSig = 0 - aSig;
#else
    if ( zSign ) aSig = - aSig;
#endif
    return normalizeRoundAndPackFloat64(aSign ^ zSign, bExp, aSig, status);

}